

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.hpp
# Opt level: O0

void __thiscall Cache::Block::Block(Block *this,Block *b)

{
  byte *in_RSI;
  byte *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000068;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000070;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1161c9);
  *in_RDI = *in_RSI & 1;
  in_RDI[1] = in_RSI[1] & 1;
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RSI + 4);
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)(in_RSI + 0xc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

Block(const Block &b) {
            valid = b.valid;
            dirty = b.dirty;
            tag = b.tag;
            id = b.id;
            size = b.size;
            data = b.data;
        }